

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_reallocstack(lua_State *L,int newsize)

{
  int iVar1;
  StkId block;
  GCObject *pGVar2;
  StkId pTVar3;
  CallInfo *pCVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  
  if (newsize < -1) {
    luaM_toobig(L);
  }
  block = L->stack;
  iVar1 = L->stacksize;
  lVar6 = (long)iVar1;
  lVar7 = (long)newsize;
  pTVar3 = (StkId)luaM_realloc_(L,block,lVar6 * 0x10,lVar7 * 0x10);
  L->stack = pTVar3;
  if (iVar1 < newsize) {
    piVar5 = &pTVar3[lVar6].tt_;
    lVar6 = lVar7 - lVar6;
    do {
      *piVar5 = 0;
      piVar5 = piVar5 + 4;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  L->stacksize = newsize;
  L->stack_last = pTVar3 + lVar7 + -5;
  L->top = (StkId)(((long)L->top - (long)block) + (long)pTVar3);
  pGVar2 = L->openupval;
  while (pGVar2 != (GCObject *)0x0) {
    (pGVar2->h).array = (TValue *)(((long)(pGVar2->h).array - (long)block) + (long)L->stack);
    pGVar2 = (pGVar2->gch).next;
  }
  for (pCVar4 = L->ci; pCVar4 != (CallInfo *)0x0; pCVar4 = pCVar4->previous) {
    pTVar3 = L->stack;
    pCVar4->top = (StkId)(((long)pCVar4->top - (long)block) + (long)pTVar3);
    pCVar4->func = (StkId)(((long)pCVar4->func - (long)block) + (long)pTVar3);
    if ((pCVar4->callstatus & 1) != 0) {
      (pCVar4->u).l.base = (StkId)((long)pTVar3 + ((long)(pCVar4->u).l.base - (long)block));
    }
  }
  return;
}

Assistant:

void luaD_reallocstack (lua_State *L, int newsize) {
  TValue *oldstack = L->stack;
  int lim = L->stacksize;
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  lua_assert(L->stack_last - L->stack == L->stacksize - EXTRA_STACK);
  luaM_reallocvector(L, L->stack, L->stacksize, newsize, TValue);
  for (; lim < newsize; lim++)
    setnilvalue(L->stack + lim); /* erase new segment */
  L->stacksize = newsize;
  L->stack_last = L->stack + newsize - EXTRA_STACK;
  correctstack(L, oldstack);
}